

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayer.cpp
# Opt level: O3

void __thiscall ILayer::ILayer(ILayer *this,LayerMeta *_meta)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  pointer pcVar4;
  undefined8 uVar5;
  INeuronBuilder *pIVar6;
  float fVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  
  this->_vptr_ILayer = (_func_int **)&PTR__ILayer_00116af0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LayerStats::LayerStats(&this->stats);
  (this->meta).alpha = _meta->alpha;
  paVar2 = &(this->meta).name.field_2;
  (this->meta).name._M_dataplus._M_p = (pointer)paVar2;
  pcVar4 = (_meta->name)._M_dataplus._M_p;
  paVar1 = &(_meta->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&(_meta->name).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->meta).name.field_2 + 8) = uVar5;
  }
  else {
    (this->meta).name._M_dataplus._M_p = pcVar4;
    (this->meta).name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->meta).name._M_string_length = (_meta->name)._M_string_length;
  (_meta->name)._M_dataplus._M_p = (pointer)paVar1;
  (_meta->name)._M_string_length = 0;
  (_meta->name).field_2._M_local_buf[0] = '\0';
  pIVar6 = _meta->neuronBuilder;
  (this->meta).size = _meta->size;
  (this->meta).neuronBuilder = pIVar6;
  fVar7 = _meta->zShift;
  (this->meta).width = _meta->width;
  (this->meta).zShift = fVar7;
  std::vector<INeuron_*,_std::allocator<INeuron_*>_>::resize(&this->neurons,(this->meta).size);
  psVar3 = &(this->meta).size;
  if (*psVar3 != 0) {
    uVar9 = 0;
    do {
      iVar8 = (**((this->meta).neuronBuilder)->_vptr_INeuronBuilder)();
      (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = (INeuron *)CONCAT44(extraout_var,iVar8);
      uVar9 = uVar9 + 1;
    } while (uVar9 < *psVar3);
  }
  return;
}

Assistant:

ILayer::ILayer( LayerMeta _meta ) : meta( std::move(_meta) )
{
    neurons.resize( meta.size );
    for ( auto idx = 0; idx < meta.size; ++idx ) {
        neurons[idx] = meta.neuronBuilder.build();
    }
}